

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O3

bool __thiscall
Assimp::XGLImporter::CanRead(XGLImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  int iVar2;
  string extension;
  char *tokens [3];
  string local_58;
  char *local_38;
  char *pcStack_30;
  char *local_28;
  
  BaseImporter::GetExtension(&local_58,pFile);
  iVar2 = std::__cxx11::string::compare((char *)&local_58);
  bVar1 = true;
  if (iVar2 != 0) {
    iVar2 = std::__cxx11::string::compare((char *)&local_58);
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::string::compare((char *)&local_58);
      if (iVar2 == 0 || checkSig) {
        if (pIOHandler == (IOSystem *)0x0) {
          __assert_fail("pIOHandler != __null",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/XGL/XGLLoader.cpp"
                        ,0x7e,
                        "virtual bool Assimp::XGLImporter::CanRead(const std::string &, IOSystem *, bool) const"
                       );
        }
        local_28 = "<WORLD>";
        local_38 = "<world>";
        pcStack_30 = "<World>";
        bVar1 = BaseImporter::SearchFileHeaderForToken(pIOHandler,pFile,&local_38,3,200,false,false)
        ;
      }
      else {
        bVar1 = false;
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return bVar1;
}

Assistant:

bool XGLImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const
{
    /* NOTE: A simple check for the file extension is not enough
     * here. XGL and ZGL are ok, but xml is too generic
     * and might be collada as well. So open the file and
     * look for typical signal tokens.
     */
    const std::string extension = GetExtension(pFile);

    if (extension == "xgl" || extension == "zgl") {
        return true;
    }
    else if (extension == "xml" || checkSig) {
        ai_assert(pIOHandler != NULL);

        const char* tokens[] = {"<world>","<World>","<WORLD>"};
        return SearchFileHeaderForToken(pIOHandler,pFile,tokens,3);
    }
    return false;
}